

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O2

void * __thiscall
boost::detail::
sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
::get_deleter(sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *this,sp_typeinfo *ti)

{
  bool bVar1;
  sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *psVar2;
  
  bVar1 = std::type_info::operator==(ti,(type_info *)&sp_ms_deleter<std::ofstream>::typeinfo);
  psVar2 = (sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x0;
  if (bVar1) {
    psVar2 = &this->del;
  }
  return psVar2;
}

Assistant:

virtual void * get_deleter( sp_typeinfo const & ti )
    {
        return ti == BOOST_SP_TYPEID(D)? &reinterpret_cast<char&>( del ): 0;
    }